

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O0

Cut_Cut_t * Cut_NodeReadCutsTemp(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pCVar1;
  int Node_local;
  Cut_Man_t *p_local;
  
  if (Node < p->vCutsTemp->nSize) {
    pCVar1 = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsTemp,Node);
    return pCVar1;
  }
  __assert_fail("Node < p->vCutsTemp->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                ,0x52,"Cut_Cut_t *Cut_NodeReadCutsTemp(Cut_Man_t *, int)");
}

Assistant:

Cut_Cut_t * Cut_NodeReadCutsTemp( Cut_Man_t * p, int Node )
{
    assert( Node < p->vCutsTemp->nSize );
    return (Cut_Cut_t *)Vec_PtrEntry( p->vCutsTemp, Node );
}